

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::internal::
BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>,_-1,_1,_true,_true>
::BlockImpl_dense(BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,__1,_1,_true,_true>
                  *this,Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false> *xpr,
                 Index i)

{
  Scalar *pSVar1;
  Index IVar2;
  Index rows;
  Index i_local;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false> *xpr_local;
  BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,__1,_1,_true,_true>
  *this_local;
  
  pSVar1 = MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>,_0>::
           data((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
                 *)xpr);
  IVar2 = BlockImpl_dense<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false,_true>::
          outerStride((BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
                       *)xpr);
  rows = MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>,_0>::
         rows((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
               *)xpr);
  MapBase<Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>,_-1,_1,_true>,_0>
  ::MapBase(&this->
             super_MapBase<Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,__1,_1,_true>,_0>
            ,pSVar1 + i * IVar2,rows,1);
  memcpy(&this->m_xpr,xpr,0x38);
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startRow,0);
  variable_if_dynamic<long,_0>::variable_if_dynamic
            ((variable_if_dynamic<long,_0> *)&this->field_0x58,i);
  init(this,(EVP_PKEY_CTX *)i);
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr, Index i)
      : Base(xpr.data() + i * (    ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && (!XprTypeIsRowMajor))
                                || ((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && ( XprTypeIsRowMajor)) ? xpr.innerStride() : xpr.outerStride()),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr),
        m_startRow( (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0),
        m_startCol( (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)
    {
      init();
    }